

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O0

VP8StatusCode VP8EnterCritical(VP8Decoder *dec,VP8Io *io)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  VP8Decoder *in_RDI;
  int extra_pixels;
  VP8StatusCode local_4;
  
  if ((*(long *)(in_RSI + 0x48) == 0) || (iVar1 = (**(code **)(in_RSI + 0x48))(in_RSI), iVar1 != 0))
  {
    if (*(int *)(in_RSI + 0x70) != 0) {
      in_RDI->filter_type_ = 0;
    }
    uVar2 = (uint)""[in_RDI->filter_type_];
    if (in_RDI->filter_type_ == 2) {
      in_RDI->tl_mb_x_ = 0;
      in_RDI->tl_mb_y_ = 0;
    }
    else {
      in_RDI->tl_mb_x_ = (int)(*(int *)(in_RSI + 0x78) - uVar2) >> 4;
      in_RDI->tl_mb_y_ = (int)(*(int *)(in_RSI + 0x80) - uVar2) >> 4;
      if (in_RDI->tl_mb_x_ < 0) {
        in_RDI->tl_mb_x_ = 0;
      }
      if (in_RDI->tl_mb_y_ < 0) {
        in_RDI->tl_mb_y_ = 0;
      }
    }
    in_RDI->br_mb_y_ = (int)(*(int *)(in_RSI + 0x84) + 0xf + uVar2) >> 4;
    in_RDI->br_mb_x_ = (int)(*(int *)(in_RSI + 0x7c) + 0xf + uVar2) >> 4;
    if (in_RDI->mb_w_ < in_RDI->br_mb_x_) {
      in_RDI->br_mb_x_ = in_RDI->mb_w_;
    }
    if (in_RDI->mb_h_ < in_RDI->br_mb_y_) {
      in_RDI->br_mb_y_ = in_RDI->mb_h_;
    }
    PrecomputeFilterStrengths(in_RDI);
    local_4 = VP8_STATUS_OK;
  }
  else {
    VP8SetError(in_RDI,VP8_STATUS_USER_ABORT,"Frame setup failed");
    local_4 = in_RDI->status_;
  }
  return local_4;
}

Assistant:

VP8StatusCode VP8EnterCritical(VP8Decoder* const dec, VP8Io* const io) {
  // Call setup() first. This may trigger additional decoding features on 'io'.
  // Note: Afterward, we must call teardown() no matter what.
  if (io->setup != NULL && !io->setup(io)) {
    VP8SetError(dec, VP8_STATUS_USER_ABORT, "Frame setup failed");
    return dec->status_;
  }

  // Disable filtering per user request
  if (io->bypass_filtering) {
    dec->filter_type_ = 0;
  }

  // Define the area where we can skip in-loop filtering, in case of cropping.
  //
  // 'Simple' filter reads two luma samples outside of the macroblock
  // and filters one. It doesn't filter the chroma samples. Hence, we can
  // avoid doing the in-loop filtering before crop_top/crop_left position.
  // For the 'Complex' filter, 3 samples are read and up to 3 are filtered.
  // Means: there's a dependency chain that goes all the way up to the
  // top-left corner of the picture (MB #0). We must filter all the previous
  // macroblocks.
  {
    const int extra_pixels = kFilterExtraRows[dec->filter_type_];
    if (dec->filter_type_ == 2) {
      // For complex filter, we need to preserve the dependency chain.
      dec->tl_mb_x_ = 0;
      dec->tl_mb_y_ = 0;
    } else {
      // For simple filter, we can filter only the cropped region.
      // We include 'extra_pixels' on the other side of the boundary, since
      // vertical or horizontal filtering of the previous macroblock can
      // modify some abutting pixels.
      dec->tl_mb_x_ = (io->crop_left - extra_pixels) >> 4;
      dec->tl_mb_y_ = (io->crop_top - extra_pixels) >> 4;
      if (dec->tl_mb_x_ < 0) dec->tl_mb_x_ = 0;
      if (dec->tl_mb_y_ < 0) dec->tl_mb_y_ = 0;
    }
    // We need some 'extra' pixels on the right/bottom.
    dec->br_mb_y_ = (io->crop_bottom + 15 + extra_pixels) >> 4;
    dec->br_mb_x_ = (io->crop_right + 15 + extra_pixels) >> 4;
    if (dec->br_mb_x_ > dec->mb_w_) {
      dec->br_mb_x_ = dec->mb_w_;
    }
    if (dec->br_mb_y_ > dec->mb_h_) {
      dec->br_mb_y_ = dec->mb_h_;
    }
  }
  PrecomputeFilterStrengths(dec);
  return VP8_STATUS_OK;
}